

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.hpp
# Opt level: O2

int cpprofiler::sendall(int s,char *buf,int *len)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  
  uVar3 = *len;
  uVar1 = uVar3;
  for (iVar4 = 0; uVar2 = (ulong)uVar1, iVar4 < (int)uVar1; iVar4 = iVar4 + (int)uVar2) {
    uVar2 = send(s,buf + iVar4,(long)(int)uVar3,0);
    if (uVar2 == 0xffffffffffffffff) break;
    uVar3 = uVar3 - (int)uVar2;
    uVar1 = *len;
  }
  *len = iVar4;
  return (int)uVar2;
}

Assistant:

static int sendall(int s, const char* buf, int* len) {
  int total = 0;         // how many bytes we've sent
  int bytesleft = *len;  // how many we have left to send
  ssize_t n;

  while (total < *len) {
    n = send(s, buf + total, static_cast<size_t>(bytesleft), 0);
    if (n == -1) {
      break;
    }
    total += static_cast<int>(n);
    bytesleft -= static_cast<int>(n);
  }

  *len = total;  // return number actually sent here

  return n == -1 ? -1 : 0;  // return -1 on failure, 0 on success
}